

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_goto_attributes(coda_cursor_conflict *cursor)

{
  coda_dynamic_type *pcVar1;
  coda_cursor_conflict *cursor_local;
  
  cursor->n = cursor->n + 1;
  if (cursor->stack[cursor->n + -2].type[1].definition == (coda_type *)0x0) {
    pcVar1 = coda_mem_empty_record((cursor->stack[cursor->n + -2].type)->definition->format);
    cursor->stack[cursor->n + -1].type = pcVar1;
  }
  else {
    cursor->stack[cursor->n + -1].type =
         (coda_dynamic_type_struct *)cursor->stack[cursor->n + -2].type[1].definition;
  }
  cursor->stack[cursor->n + -1].index = -1;
  cursor->stack[cursor->n + -1].bit_offset = -1;
  return 0;
}

Assistant:

int coda_mem_cursor_goto_attributes(coda_cursor *cursor)
{
    cursor->n++;
    if (((coda_mem_type *)cursor->stack[cursor->n - 2].type)->attributes != NULL)
    {
        cursor->stack[cursor->n - 1].type =
            (coda_dynamic_type *)((coda_mem_type *)cursor->stack[cursor->n - 2].type)->attributes;
    }
    else
    {
        cursor->stack[cursor->n - 1].type =
            coda_mem_empty_record(cursor->stack[cursor->n - 2].type->definition->format);
    }
    /* we use the special index value '-1' to indicate that we are pointing to the attributes of the parent */
    cursor->stack[cursor->n - 1].index = -1;
    cursor->stack[cursor->n - 1].bit_offset = -1;

    return 0;
}